

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testAddIntegerWithTags_Test::TestBody(Engine_testAddIntegerWithTags_Test *this)

{
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar1;
  long lVar2;
  char *pcVar3;
  AssertHelper local_138;
  AssertHelper local_130;
  AssertionResult gtest_ar_1;
  _Head_base<0UL,_Handler_*,_false> local_118;
  value_type im;
  Engine e;
  Tag local_88;
  Tag local_48;
  
  std::make_unique<TestHandler>();
  local_118._M_head_impl = (Handler *)im.time;
  im.time.__d.__r = (duration)0;
  Engine::Engine(&e,"test",(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_118);
  if (local_118._M_head_impl != (Handler *)0x0) {
    (*(local_118._M_head_impl)->_vptr_Handler[3])();
  }
  local_118._M_head_impl = (Handler *)0x0;
  if (im.time.__d.__r != 0) {
    (**(code **)(*(long *)im.time.__d.__r + 0x18))();
  }
  std::__cxx11::string::string((string *)&im,"foo",(allocator *)&local_138);
  gtest_ar_1._0_4_ = 100000000;
  Tag::Tag(&local_48,"Hello","World");
  Tag::Tag(&local_88,"Another","Tag");
  Engine::Add<int,_nullptr,_Tag,_Tag>(&e,(string *)&im,(int *)&gtest_ar_1,&local_48,&local_88);
  Tag::~Tag(&local_88);
  Tag::~Tag(&local_48);
  std::__cxx11::string::~string((string *)&im);
  pvVar1 = Engine::GetHandlers(&e);
  lVar2 = __dynamic_cast((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
                         (((pvVar1->
                           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t,
                         &Handler::typeinfo,&TestHandler::typeinfo,0);
  local_138.data_._0_4_ = 1;
  gtest_ar_1._0_8_ = (*(long *)(lVar2 + 0x10) - *(long *)(lVar2 + 8)) / 0x50;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&im,"1","th->intMeasures.size()",(int *)&local_138,
             (unsigned_long *)&gtest_ar_1);
  if ((char)im.time.__d.__r == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (im.name._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)im.name._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&im.name);
    goto LAB_001145cc;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&im.name);
  Measure<int>::Measure(&im,*(Measure<int> **)(lVar2 + 8));
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"test.foo\"","im.name",(char (*) [9])"test.foo",&im.name);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
LAB_001145a3:
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_138.data_ = local_138.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<MetricTypes::MetricType,MetricTypes::MetricType>
              ((internal *)&gtest_ar_1,"MetricType::Counter","im.type",(MetricType *)&local_138,
               &im.type);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      goto LAB_001145a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_138.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,float>
              ((internal *)&gtest_ar_1,"1","im.rate",(int *)&local_138,&im.rate);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x78,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      goto LAB_001145a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_138.data_._0_4_ = 100000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"100000000","im.value",(int *)&local_138,&im.value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x79,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      goto LAB_001145a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_130.data_._0_4_ = 2;
    local_138.data_ =
         (AssertHelperData *)
         ((long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start >> 6);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_1,"2","im.tags.size()",(int *)&local_130,
               (unsigned_long *)&local_138);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x7a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      goto LAB_001145a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Hello\"","im.tags[0].name",(char (*) [6])"Hello",
               &(im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x7b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      goto LAB_001145a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"World\"","im.tags[0].value",(char (*) [6])"World",
               &(im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x7c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      goto LAB_001145a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Another\"","im.tags[1].name",(char (*) [8])"Another",
               &im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x7d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      goto LAB_001145a3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Tag\"","im.tags[1].value",(char (*) [4])"Tag",
               &im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_138);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x7e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_138);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  Measure<int>::~Measure(&im);
LAB_001145cc:
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testAddIntegerWithTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Add("foo", 100000000, Tag("Hello", "World"), Tag("Another", "Tag"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Hello", im.tags[0].name);
    ASSERT_EQ("World", im.tags[0].value);
    ASSERT_EQ("Another", im.tags[1].name);
    ASSERT_EQ("Tag", im.tags[1].value);
}